

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::InvalidateBufferStorageTestCase::initTestCaseGlobal(InvalidateBufferStorageTestCase *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = this->m_page_size;
  uVar2 = this->m_n_pages_to_use * uVar1;
  this->m_sparse_bo_size = uVar2;
  this->m_sparse_bo_size_rounded = (uVar1 - uVar2 % uVar1) % uVar1 + uVar2;
  return true;
}

Assistant:

bool InvalidateBufferStorageTestCase::initTestCaseGlobal()
{
	const unsigned int n_bytes_needed = m_n_pages_to_use * m_page_size;

	/* Determine the number of bytes both the helper and the sparse buffer
	 * object need to be able to hold, at maximum */
	m_sparse_bo_size		 = n_bytes_needed;
	m_sparse_bo_size_rounded = SparseBufferTestUtilities::alignOffset(n_bytes_needed, m_page_size);

	return true;
}